

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O1

GdlFeatureSetting * __thiscall GdlFeatureDefn::FindSetting(GdlFeatureDefn *this,string *sta)

{
  pointer ppGVar1;
  size_t sVar2;
  GdlFeatureSetting *pGVar3;
  size_t __n;
  int iVar4;
  long lVar5;
  long lVar6;
  
  ppGVar1 = (this->m_vpfset).
            super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(this->m_vpfset).
                super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    sVar2 = sta->_M_string_length;
    lVar5 = 0;
    do {
      pGVar3 = ppGVar1[lVar5];
      __n = (pGVar3->m_staName)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          return pGVar3;
        }
        iVar4 = bcmp((pGVar3->m_staName)._M_dataplus._M_p,(sta->_M_dataplus)._M_p,__n);
        if (iVar4 == 0) {
          return pGVar3;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
  }
  return (GdlFeatureSetting *)0x0;
}

Assistant:

GdlFeatureSetting * GdlFeatureDefn::FindSetting(std::string sta)
{
	for (size_t i = 0; i < m_vpfset.size(); ++i)
	{
		if (m_vpfset[i]->m_staName == sta)
			return m_vpfset[i];
	}
	return NULL;
}